

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O0

void deliver_by_window(qtmsg *qt_msg)

{
  nh_menuitem *pnVar1;
  size_t sVar2;
  nh_menuitem *_item_;
  menulist menu;
  char xbuf [256];
  long size;
  qtmsg *qt_msg_local;
  
  init_menulist((menulist *)&_item_);
  xbuf[0xf8] = '\0';
  xbuf[0xf9] = '\0';
  xbuf[0xfa] = '\0';
  xbuf[0xfb] = '\0';
  xbuf[0xfc] = '\0';
  xbuf[0xfd] = '\0';
  xbuf[0xfe] = '\0';
  xbuf[0xff] = '\0';
  for (; (long)xbuf._248_8_ < qt_msg->size; xbuf._248_8_ = sVar2 + xbuf._248_8_) {
    dlb_fgets(&menu.size,0x50,msg_file);
    xcrypt((char *)&menu.size,in_line);
    convert_line();
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
    }
    pnVar1 = _item_ + menu.items._4_4_;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,out_line);
    menu.items._4_4_ = menu.items._4_4_ + 1;
    sVar2 = strlen(in_line);
  }
  display_menu(_item_,menu.items._4_4_,(char *)0x0,0,(int *)0x0);
  free(_item_);
  return;
}

Assistant:

static void deliver_by_window(struct qtmsg *qt_msg)
{
	long size;
	char xbuf[BUFSZ];
	struct menulist menu;
	init_menulist(&menu);

	for (size = 0; size < qt_msg->size; size += (long)strlen(in_line)) {
	    dlb_fgets(xbuf, 80, msg_file);
	    xcrypt(xbuf, in_line);
	    convert_line();
	    add_menutext(&menu, out_line);
	}
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
	free(menu.items);
}